

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed.cc
# Opt level: O1

bool TimeFunctionParallel(TimeResults *results,function<bool_()> *func)

{
  long *plVar1;
  _Manager_type p_Var2;
  TimeResults *pTVar3;
  undefined4 uVar4;
  pointer ptVar5;
  pointer ptVar6;
  size_type sVar7;
  TimeResults *pTVar8;
  bool bVar9;
  long *plVar10;
  ulong uVar11;
  anon_class_40_5_9d02135f_for__M_head_impl *paVar12;
  anon_class_40_5_9d02135f_for__M_head_impl *extraout_RDX;
  anon_class_40_5_9d02135f_for__M_head_impl *extraout_RDX_00;
  anon_class_40_5_9d02135f_for__M_head_impl *extraout_RDX_01;
  anon_class_40_5_9d02135f_for__M_head_impl *paVar13;
  uint64_t uVar14;
  int iVar15;
  thread *thread;
  vector<std::thread,_std::allocator<std::thread>_> *__range1;
  uint64_t uVar16;
  ulong uVar17;
  anon_class_40_5_9d02135f_for__M_head_impl *paVar18;
  long lVar19;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  vector<ThreadResult,_std::allocator<ThreadResult>_> thread_results;
  uint32_t iterations_between_time_checks;
  Latch latch;
  vector<std::thread,_std::allocator<std::thread>_> local_158;
  long *local_138;
  long *plStack_130;
  long *local_128;
  uint32_t local_114;
  size_type local_110;
  _Any_data local_108;
  _Manager_type local_f8;
  _Invoker_type local_f0;
  TimeResults *local_e8;
  function<bool_()> *local_e0;
  thread local_d8;
  int *local_d0;
  long **local_c8;
  function<bool_()> *local_c0;
  uint32_t *local_b8;
  _Any_data local_b0;
  code *local_a0;
  int local_90 [2];
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  condition_variable local_60 [48];
  
  if (g_threads < 2) {
    local_108._M_unused._M_object = (void *)0x0;
    local_108._8_8_ = 0;
    local_f8 = (_Manager_type)0x0;
    local_f0 = func->_M_invoker;
    p_Var2 = (func->super__Function_base)._M_manager;
    if (p_Var2 != (_Manager_type)0x0) {
      local_108._M_unused._0_8_ =
           (undefined8)*(undefined8 *)&(func->super__Function_base)._M_functor;
      local_108._8_8_ = *(undefined8 *)((long)&(func->super__Function_base)._M_functor + 8);
      (func->super__Function_base)._M_manager = (_Manager_type)0x0;
      func->_M_invoker = (_Invoker_type)0x0;
      local_f8 = p_Var2;
    }
    bVar9 = TimeFunction(results,(function<bool_()> *)&local_108);
    if (local_f8 != (_Manager_type)0x0) {
      (*local_f8)(&local_108,&local_108,__destroy_functor);
    }
  }
  else {
    local_e0 = func;
    std::function<bool_()>::function((function<bool_()> *)&local_b0,func);
    local_114 = IterationsBetweenTimeChecks((function<bool_()> *)&local_b0);
    if (local_a0 != (code *)0x0) {
      (*local_a0)(&local_b0,&local_b0,__destroy_functor);
    }
    iVar15 = g_threads;
    if (local_114 == 0) {
      bVar9 = false;
    }
    else {
      lVar19 = (long)g_threads;
      if (lVar19 < 0) {
        std::__throw_length_error("cannot create std::vector larger than max_size()");
      }
      local_138 = (long *)0x0;
      plStack_130 = (long *)0x0;
      local_128 = (long *)0x0;
      if (g_threads == 0) {
        plVar10 = (long *)0x0;
      }
      else {
        plVar10 = (long *)operator_new(lVar19 * 0x18);
      }
      local_128 = plVar10 + lVar19 * 3;
      local_138 = plVar10;
      local_e8 = results;
      if (iVar15 != 0) {
        plStack_130 = plVar10;
        memset(plVar10,0,lVar19 * 0x18);
        plVar10 = plVar10 + lVar19 * 3;
      }
      local_90[0] = g_threads;
      local_88 = 0;
      uStack_80 = 0;
      local_78 = 0;
      uStack_70 = 0;
      local_68 = 0;
      plStack_130 = plVar10;
      std::condition_variable::condition_variable(local_60);
      local_158.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_158.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_158.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      paVar12 = (anon_class_40_5_9d02135f_for__M_head_impl *)
                local_158.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_start;
      paVar18 = (anon_class_40_5_9d02135f_for__M_head_impl *)
                local_158.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_finish;
      pTVar3 = local_e8;
      if (0 < g_threads) {
        iVar15 = 0;
        paVar13 = extraout_RDX;
        do {
          ptVar6 = local_158.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          ptVar5 = local_158.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_d0 = local_90;
          local_c8 = &local_138;
          local_c0 = local_e0;
          local_b8 = &local_114;
          local_d8._M_id._M_thread._0_4_ = iVar15;
          if (local_158.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_158.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            if ((long)local_158.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_158.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                      _M_impl.super__Vector_impl_data._M_start == 0x7ffffffffffffff8) {
              std::__throw_length_error("vector::_M_realloc_insert");
            }
            uVar17 = (long)local_158.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)local_158.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                           _M_impl.super__Vector_impl_data._M_start >> 3;
            uVar11 = uVar17 + (uVar17 == 0);
            local_110 = uVar11 + uVar17;
            if (0xffffffffffffffe < local_110) {
              local_110 = 0xfffffffffffffff;
            }
            if (CARRY8(uVar11,uVar17)) {
              local_110 = 0xfffffffffffffff;
            }
            if (local_110 == 0) {
              paVar12 = (anon_class_40_5_9d02135f_for__M_head_impl *)0x0;
            }
            else {
              paVar12 = (anon_class_40_5_9d02135f_for__M_head_impl *)
                        __gnu_cxx::new_allocator<std::thread>::allocate
                                  ((new_allocator<std::thread> *)&local_158,local_110,(void *)0x0);
              paVar13 = extraout_RDX_01;
            }
            std::allocator_traits<std::allocator<std::thread>>::
            construct<std::thread,TimeFunctionParallel(TimeResults*,std::function<bool()>)::__0>
                      ((allocator_type *)((id *)&paVar12->i + uVar17),&local_d8,paVar13);
            sVar7 = local_110;
            paVar18 = paVar12;
            for (paVar13 = (anon_class_40_5_9d02135f_for__M_head_impl *)ptVar5;
                paVar13 != (anon_class_40_5_9d02135f_for__M_head_impl *)ptVar6;
                paVar13 = (anon_class_40_5_9d02135f_for__M_head_impl *)&paVar13->latch) {
              *(id *)paVar18 = (id)0x0;
              uVar4 = *(undefined4 *)&paVar13->field_0x4;
              paVar18->i = paVar13->i;
              *(undefined4 *)&paVar18->field_0x4 = uVar4;
              *(id *)paVar13 = (id)0x0;
              paVar18 = (anon_class_40_5_9d02135f_for__M_head_impl *)&paVar18->latch;
            }
            if ((anon_class_40_5_9d02135f_for__M_head_impl *)ptVar5 !=
                (anon_class_40_5_9d02135f_for__M_head_impl *)0x0) {
              operator_delete(ptVar5,(long)local_158.
                                           super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                     (long)ptVar5);
            }
            local_158.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)((id *)&paVar12->i + sVar7);
            local_158.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)paVar12;
          }
          else {
            std::allocator_traits<std::allocator<std::thread>>::
            construct<std::thread,TimeFunctionParallel(TimeResults*,std::function<bool()>)::__0>
                      ((allocator_type *)
                       local_158.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&local_d8,paVar13);
            paVar12 = extraout_RDX_00;
            paVar18 = (anon_class_40_5_9d02135f_for__M_head_impl *)
                      local_158.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          }
          local_158.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)&paVar18->latch;
          iVar15 = iVar15 + 1;
          paVar13 = paVar12;
          paVar12 = (anon_class_40_5_9d02135f_for__M_head_impl *)
                    local_158.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                    super__Vector_impl_data._M_start;
          paVar18 = (anon_class_40_5_9d02135f_for__M_head_impl *)
                    local_158.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          pTVar3 = local_e8;
        } while (iVar15 < g_threads);
      }
      for (; pTVar8 = local_e8,
          ptVar5 = local_158.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                   super__Vector_impl_data._M_finish,
          paVar12 !=
          (anon_class_40_5_9d02135f_for__M_head_impl *)
          local_158.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_finish;
          paVar12 = (anon_class_40_5_9d02135f_for__M_head_impl *)&paVar12->latch) {
        local_158.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)paVar18;
        local_e8 = pTVar3;
        std::thread::join();
        paVar18 = (anon_class_40_5_9d02135f_for__M_head_impl *)
                  local_158.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        pTVar3 = local_e8;
        local_e8 = pTVar8;
        local_158.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish = ptVar5;
      }
      local_e8->num_calls = 0;
      local_e8->us = 0;
      bVar9 = local_138 == plStack_130;
      if ((!bVar9) && ((char)local_138[2] == '\x01')) {
        uVar14 = local_e8->num_calls;
        uVar16 = local_e8->us;
        plVar10 = local_138;
        do {
          uVar14 = uVar14 + *plVar10;
          local_e8->num_calls = uVar14;
          uVar16 = uVar16 + plVar10[1];
          local_e8->us = uVar16;
          bVar9 = plVar10 + 3 == plStack_130;
          if (bVar9) break;
          plVar1 = plVar10 + 5;
          plVar10 = plVar10 + 3;
        } while ((char)*plVar1 == '\x01');
      }
      local_158.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)paVar18;
      local_e8 = pTVar3;
      std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_158);
      std::condition_variable::~condition_variable(local_60);
      if (local_138 != (long *)0x0) {
        operator_delete(local_138,(long)local_128 - (long)local_138);
      }
    }
  }
  return bVar9;
}

Assistant:

static bool TimeFunctionParallel(TimeResults *results,
                                 std::function<bool()> func) {
  if (g_threads <= 1) {
    return TimeFunction(results, std::move(func));
  }

  uint32_t iterations_between_time_checks = IterationsBetweenTimeChecks(func);
  if (iterations_between_time_checks == 0) {
    return false;
  }

  struct ThreadResult {
    TimeResults time_result;
    bool ok = false;
  };
  std::vector<ThreadResult> thread_results(g_threads);
  Latch latch(g_threads);
  std::vector<std::thread> threads;
  for (int i = 0; i < g_threads; i++) {
    threads.emplace_back([&, i] {
      // Wait for all the threads to be ready before running the benchmark.
      latch.ArriveAndWait();
      thread_results[i].ok = TimeFunctionImpl(
          &thread_results[i].time_result, func, iterations_between_time_checks);
    });
  }

  for (auto &thread : threads) {
    thread.join();
  }

  results->num_calls = 0;
  results->us = 0;
  for (const auto &pair : thread_results) {
    if (!pair.ok) {
      return false;
    }
    results->num_calls += pair.time_result.num_calls;
    results->us += pair.time_result.us;
  }
  return true;
}